

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

ArrayBuilder<kj::HttpByteRange> * __thiscall
kj::ArrayBuilder<kj::HttpByteRange>::operator=
          (ArrayBuilder<kj::HttpByteRange> *this,ArrayBuilder<kj::HttpByteRange> *other)

{
  HttpByteRange *pHVar1;
  RemoveConst<kj::HttpByteRange> *pRVar2;
  HttpByteRange *pHVar3;
  
  pHVar1 = this->ptr;
  if (pHVar1 != (HttpByteRange *)0x0) {
    pRVar2 = this->pos;
    pHVar3 = this->endPtr;
    this->ptr = (HttpByteRange *)0x0;
    this->pos = (RemoveConst<kj::HttpByteRange> *)0x0;
    this->endPtr = (HttpByteRange *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pHVar1,0x10,(long)pRVar2 - (long)pHVar1 >> 4,
               (long)pHVar3 - (long)pHVar1 >> 4,0);
  }
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (HttpByteRange *)0x0;
  other->pos = (RemoveConst<kj::HttpByteRange> *)0x0;
  other->endPtr = (HttpByteRange *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }